

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UBool __thiscall
icu_63::Normalizer2WithImpl::isNormalized
          (Normalizer2WithImpl *this,UnicodeString *s,UErrorCode *errorCode)

{
  ushort uVar1;
  int iVar2;
  char16_t *pcVar3;
  undefined4 extraout_var;
  int iVar4;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        pcVar3 = (s->fUnion).fFields.fArray;
      }
      else {
        pcVar3 = (char16_t *)((long)&s->fUnion + 2);
      }
    }
    else {
      pcVar3 = (char16_t *)0x0;
    }
    if (pcVar3 != (char16_t *)0x0) {
      if ((short)uVar1 < 0) {
        iVar4 = (s->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      iVar2 = (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x14])
                        (this,pcVar3,pcVar3 + iVar4);
      return pcVar3 + iVar4 == (char16_t *)CONCAT44(extraout_var,iVar2);
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return '\0';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }